

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O0

Vec_Ptr_t * populateSafetyAssumptionVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNode_00;
  Aig_Obj_t *Entry;
  Vec_Ptr_t *vAssumeSafety;
  int assumeSafetyCounter;
  int i;
  Abc_Obj_t *pNode;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  vAssumeSafety._0_4_ = 0;
  p = Vec_PtrAlloc(100);
  for (vAssumeSafety._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), vAssumeSafety._4_4_ < iVar1;
      vAssumeSafety._4_4_ = vAssumeSafety._4_4_ + 1) {
    pNode_00 = Abc_NtkPo(pNtk,vAssumeSafety._4_4_);
    iVar1 = nodeName_starts_with(pNode_00,"assume_safety");
    if ((iVar1 != 0) || (iVar1 = nodeName_starts_with(pNode_00,"Assume"), iVar1 != 0)) {
      Entry = Aig_ManCo(pAig,vAssumeSafety._4_4_);
      Vec_PtrPush(p,Entry);
      vAssumeSafety._0_4_ = (uint)vAssumeSafety + 1;
    }
  }
  printf("Number of assume_safety property found = %d\n",(ulong)(uint)vAssumeSafety);
  return p;
}

Assistant:

Vec_Ptr_t * populateSafetyAssumptionVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, assumeSafetyCounter = 0;
    Vec_Ptr_t * vAssumeSafety;

    vAssumeSafety = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        //if( strstr( Abc_ObjName( pNode ), "Assert") != NULL )
        if( nodeName_starts_with( pNode, "assume_safety" ) || nodeName_starts_with( pNode, "Assume" ))
        {
            Vec_PtrPush( vAssumeSafety, Aig_ManCo( pAig, i ) );
            assumeSafetyCounter++;
        }
    printf("Number of assume_safety property found = %d\n", assumeSafetyCounter);
    return vAssumeSafety;
}